

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartReg.c
# Opt level: O2

int Aig_ManRegFindBestVar(Aig_ManPre_t *p)

{
  int iVar1;
  int i_00;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  int i;
  int i_01;
  int iVar4;
  int iVar5;
  
  i_01 = 0;
  iVar3 = -1;
  iVar1 = 1000000000;
  while( true ) {
    if (p->vFreeVars->nSize <= i_01) {
      return iVar3;
    }
    i_00 = Vec_IntEntry(p->vFreeVars,i_01);
    p_00 = (Vec_Int_t *)Vec_PtrEntry(p->vMatrix,i_00);
    iVar5 = 0;
    for (iVar4 = 0; iVar4 < p_00->nSize; iVar4 = iVar4 + 1) {
      iVar2 = Vec_IntEntry(p_00,iVar4);
      if (p->pfPartVars[iVar2] == '\0') {
        iVar5 = iVar5 + p->pfUsedRegs[iVar2] * 3 + 1;
      }
    }
    if (iVar5 == 0) break;
    iVar4 = iVar5;
    if (iVar1 < iVar5) {
      iVar4 = iVar1;
    }
    if (iVar5 < iVar1) {
      iVar3 = i_00;
    }
    i_01 = i_01 + 1;
    iVar1 = iVar4;
  }
  return i_00;
}

Assistant:

int Aig_ManRegFindBestVar( Aig_ManPre_t * p )
{
    Vec_Int_t * vSupp;
    int nNewVars, nNewVarsBest = ABC_INFINITY;
    int iVarFree, iVarSupp, iVarBest = -1, i, k;
    // go through the free variables
    Vec_IntForEachEntry( p->vFreeVars, iVarFree, i )
    {
//        if ( p->pfUsedRegs[iVarFree] )
//            continue;
        // get support of this variable
        vSupp = (Vec_Int_t *)Vec_PtrEntry( p->vMatrix, iVarFree );
        // count the number of new vars
        nNewVars = 0;
        Vec_IntForEachEntry( vSupp, iVarSupp, k )
        {
            if ( p->pfPartVars[iVarSupp] )
                continue;
            nNewVars += 1 + 3 * p->pfUsedRegs[iVarSupp];
        }
        // quit if there is no new variables
        if ( nNewVars == 0 )
            return iVarFree;
        // compare the cost of this
        if ( nNewVarsBest > nNewVars )
        {
            nNewVarsBest = nNewVars;
            iVarBest = iVarFree;
        }
    }
    return iVarBest;
}